

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::DateTimePicker::sizeHint(DateTimePicker *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  DateTimePickerPrivate *pDVar5;
  qsizetype qVar6;
  const_reference this_00;
  reference pSVar7;
  int local_a8;
  int local_a4;
  int i;
  int widgetWidth;
  QString local_90;
  QRect local_74;
  QStyleOption local_58 [8];
  QStyleOption opt;
  undefined1 local_38 [32];
  DateTimePicker *local_18;
  DateTimePicker *this_local;
  
  local_18 = this;
  QStyleOption::QStyleOption(local_58,1,0);
  QStyleOption::initFrom((QWidget *)local_58);
  QLatin1String::QLatin1String((QLatin1String *)&i,"AM");
  QString::QString(&local_90,_i);
  local_74 = (QRect)QFontMetrics::boundingRect((QString *)local_38);
  iVar4 = QRect::height(&local_74);
  pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  pDVar5->itemHeight = iVar4;
  QString::~QString(&local_90);
  pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  iVar4 = pDVar5->itemHeight;
  pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  pDVar5->itemTopMargin = iVar4 / 3;
  pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  iVar4 = pDVar5->itemHeight;
  pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  iVar1 = pDVar5->itemsMaxCount;
  pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  iVar2 = pDVar5->itemsMaxCount;
  pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  iVar3 = pDVar5->itemTopMargin;
  pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  pDVar5->widgetHeight = iVar4 * iVar1 + (iVar2 + -1) * iVar3;
  pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  iVar4 = pDVar5->widgetHeight;
  pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  iVar1 = pDVar5->itemHeight;
  pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  pDVar5->currentItemY = iVar4 / 2 - iVar1 / 2;
  local_a4 = 0;
  local_a8 = 0;
  while( true ) {
    pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    qVar6 = QList<QtMWidgets::Section>::size(&(pDVar5->super_DateTimeParser).sections);
    if (qVar6 <= local_a8) break;
    pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    this_00 = QList<QtMWidgets::Section>::at
                        (&(pDVar5->super_DateTimeParser).sections,(long)local_a8);
    iVar4 = Section::maxWidth(this_00,local_58);
    pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    pSVar7 = QList<QtMWidgets::Section>::operator[]
                       (&(pDVar5->super_DateTimeParser).sections,(long)local_a8);
    pSVar7->sectionWidth = iVar4;
    pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    iVar4 = pDVar5->itemSideMargin;
    pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    pSVar7 = QList<QtMWidgets::Section>::operator[]
                       (&(pDVar5->super_DateTimeParser).sections,(long)local_a8);
    pSVar7->sectionWidth = pSVar7->sectionWidth + iVar4 * 2 + 6;
    pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    pSVar7 = QList<QtMWidgets::Section>::operator[]
                       (&(pDVar5->super_DateTimeParser).sections,(long)local_a8);
    local_a4 = pSVar7->sectionWidth + local_a4;
    local_a8 = local_a8 + 1;
  }
  pDVar5 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  QSize::QSize((QSize *)&this_local,local_a4,pDVar5->widgetHeight);
  QStyleOption::~QStyleOption(local_58);
  return (QSize)this_local;
}

Assistant:

QSize
DateTimePicker::sizeHint() const
{
	QStyleOption opt;
	opt.initFrom( this );

	d->itemHeight = opt.fontMetrics.boundingRect( QLatin1String( "AM" ) )
		.height();

	d->itemTopMargin = d->itemHeight / 3;

	d->widgetHeight = d->itemHeight * d->itemsMaxCount +
		( d->itemsMaxCount - 1 ) * d->itemTopMargin;

	d->currentItemY = d->widgetHeight / 2 - d->itemHeight / 2;

	int widgetWidth = 0;

	for( int i = 0; i < d->sections.size(); ++i )
	{
		d->sections[ i ].sectionWidth = d->sections.at( i ).maxWidth( opt );
		d->sections[ i ].sectionWidth += d->itemSideMargin * 2 + 6;
		widgetWidth += d->sections[ i ].sectionWidth;
	}

	return QSize( widgetWidth, d->widgetHeight );
}